

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsgf.c
# Opt level: O0

jsgf_rule_t * jsgf_define_rule(jsgf_t *jsgf,char *name,jsgf_rhs_t *rhs,int is_public)

{
  size_t sVar1;
  jsgf_rule_t *val_00;
  char *pcVar2;
  jsgf_rule_t *pjVar3;
  char *newname;
  void *val;
  jsgf_rule_t *rule;
  int is_public_local;
  jsgf_rhs_t *rhs_local;
  char *name_local;
  jsgf_t *jsgf_local;
  
  if (name == (char *)0x0) {
    sVar1 = strlen(jsgf->name);
    rhs_local = (jsgf_rhs_t *)
                __ckd_malloc__(sVar1 + 0x10,
                               "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/jsgf.c"
                               ,0x275);
    sprintf((char *)rhs_local,"<%s.g%05d>",jsgf->name,(ulong)(uint)jsgf->rules->inuse);
  }
  else {
    rhs_local = (jsgf_rhs_t *)jsgf_fullname(jsgf,name);
  }
  val_00 = (jsgf_rule_t *)
           __ckd_calloc__(1,0x28,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/jsgf.c"
                          ,0x280);
  val_00->refcnt = 1;
  pcVar2 = __ckd_salloc__((char *)rhs_local,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/jsgf.c"
                          ,0x282);
  val_00->name = pcVar2;
  val_00->rhs = rhs;
  val_00->is_public = is_public;
  pcVar2 = "";
  if (val_00->is_public != 0) {
    pcVar2 = "PUBLIC ";
  }
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/jsgf.c"
          ,0x287,"Defined rule: %s%s\n",pcVar2,val_00->name);
  pjVar3 = (jsgf_rule_t *)hash_table_enter(jsgf->rules,(char *)rhs_local,val_00);
  if (pjVar3 != val_00) {
    err_msg(ERR_WARN,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/jsgf.c"
            ,0x28a,"Multiply defined symbol: %s\n",rhs_local);
  }
  return val_00;
}

Assistant:

jsgf_rule_t *
jsgf_define_rule(jsgf_t * jsgf, char *name, jsgf_rhs_t * rhs,
                 int is_public)
{
    jsgf_rule_t *rule;
    void *val;

    if (name == NULL) {
        name = ckd_malloc(strlen(jsgf->name) + 16);
        sprintf(name, "<%s.g%05d>", jsgf->name,
                hash_table_inuse(jsgf->rules));
    }
    else {
        char *newname;

        newname = jsgf_fullname(jsgf, name);
        name = newname;
    }

    rule = ckd_calloc(1, sizeof(*rule));
    rule->refcnt = 1;
    rule->name = ckd_salloc(name);
    rule->rhs = rhs;
    rule->is_public = is_public;

    E_INFO("Defined rule: %s%s\n",
           rule->is_public ? "PUBLIC " : "", rule->name);
    val = hash_table_enter(jsgf->rules, name, rule);
    if (val != (void *) rule) {
        E_WARN("Multiply defined symbol: %s\n", name);
    }
    return rule;
}